

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatPrinter_p.cpp
# Opt level: O0

string * __thiscall
BamTools::Internal::SamFormatPrinter::ToString_abi_cxx11_(SamFormatPrinter *this)

{
  string *in_RDI;
  stringstream out;
  stringstream *in_stack_000000e8;
  SamFormatPrinter *in_stack_000000f0;
  stringstream *in_stack_fffffffffffffe58;
  SamFormatPrinter *in_stack_fffffffffffffe60;
  stringstream local_198 [192];
  stringstream *in_stack_ffffffffffffff28;
  SamFormatPrinter *in_stack_ffffffffffffff30;
  stringstream *in_stack_ffffffffffffff98;
  SamFormatPrinter *in_stack_ffffffffffffffa0;
  stringstream *in_stack_ffffffffffffffc8;
  SamFormatPrinter *in_stack_ffffffffffffffd0;
  
  std::__cxx11::stringstream::stringstream(local_198);
  PrintHD(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  PrintSQ(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  PrintRG(in_stack_000000f0,in_stack_000000e8);
  PrintPG(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  PrintCO(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

const std::string SamFormatPrinter::ToString() const
{

    // clear out stream
    std::stringstream out;

    // generate formatted header text
    PrintHD(out);
    PrintSQ(out);
    PrintRG(out);
    PrintPG(out);
    PrintCO(out);

    // return result
    return out.str();
}